

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

void __thiscall ipx::Basis::SolveForUpdate(Basis *this,Int j)

{
  Int IVar1;
  Int IVar2;
  int iVar3;
  Int *pIVar4;
  double *pdVar5;
  double *in_RDI;
  double dVar6;
  double *bx;
  Int *bi;
  Int nz;
  Int end;
  Int begin;
  SparseMatrix *AI;
  Timer timer;
  Int p;
  SparseMatrix *in_stack_ffffffffffffffc0;
  Timer *this_00;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  IVar1 = PositionOf((Basis *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (Int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  Timer::Timer((Timer *)in_stack_ffffffffffffffc0);
  if (IVar1 < 0) {
    Model::AI((Model *)in_RDI[1]);
    IVar1 = SparseMatrix::begin(in_stack_ffffffffffffffc0,(Int)((ulong)in_RDI >> 0x20));
    IVar2 = SparseMatrix::end(in_stack_ffffffffffffffc0,(Int)((ulong)in_RDI >> 0x20));
    iVar3 = IVar2 - IVar1;
    pIVar4 = SparseMatrix::rowidx((SparseMatrix *)0x80bbf4);
    IVar2 = (Int)((ulong)(pIVar4 + IVar1) >> 0x20);
    pdVar5 = SparseMatrix::values((SparseMatrix *)0x80bc0f);
    this_00 = (Timer *)(pdVar5 + IVar1);
    std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
              ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)0x80bc2d);
    LuUpdate::FtranForUpdate
              ((LuUpdate *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),IVar2,(Int *)this_00,in_RDI);
    dVar6 = Timer::Elapsed(this_00);
    in_RDI[0xd] = dVar6 + in_RDI[0xd];
  }
  else {
    std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
              ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)0x80bc6a);
    LuUpdate::BtranForUpdate((LuUpdate *)in_stack_ffffffffffffffc0,(Int)((ulong)in_RDI >> 0x20));
    dVar6 = Timer::Elapsed((Timer *)in_stack_ffffffffffffffc0);
    in_RDI[0xe] = dVar6 + in_RDI[0xe];
  }
  return;
}

Assistant:

void Basis::SolveForUpdate(Int j) {
    const Int p = PositionOf(j);
    Timer timer;
    if (p < 0) {
        const SparseMatrix& AI = model_.AI();
        Int begin = AI.begin(j);
        Int end = AI.end(j);
        Int nz = end-begin;
        const Int* bi = AI.rowidx() + begin;
        const double* bx = AI.values() + begin;
        lu_->FtranForUpdate(nz, bi, bx);
        time_ftran_ += timer.Elapsed();
    }
    else {
        lu_->BtranForUpdate(p);
        time_btran_ += timer.Elapsed();
    }
}